

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O1

int ARKodeSPRKTable_ToButcher
              (ARKodeSPRKTable sprk_table,ARKodeButcherTable *a_ptr,ARKodeButcherTable *b_ptr)

{
  int iVar1;
  sunrealtype *psVar2;
  sunrealtype *psVar3;
  sunrealtype *psVar4;
  sunrealtype *psVar5;
  sunrealtype *psVar6;
  sunrealtype *psVar7;
  sunrealtype *psVar8;
  ARKodeButcherTable B;
  ARKodeButcherTable pAVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  sunrealtype sVar17;
  
  B = ARKodeButcherTable_Alloc(sprk_table->stages,0);
  iVar12 = -0x14;
  if (B != (ARKodeButcherTable)0x0) {
    pAVar9 = ARKodeButcherTable_Alloc(sprk_table->stages,0);
    if (pAVar9 == (ARKodeButcherTable)0x0) {
      ARKodeButcherTable_Free(B);
    }
    else {
      iVar12 = sprk_table->stages;
      lVar10 = (long)iVar12;
      if (0 < lVar10) {
        psVar2 = sprk_table->ahat;
        psVar3 = pAVar9->c;
        psVar4 = pAVar9->b;
        iVar1 = sprk_table->q;
        psVar5 = sprk_table->a;
        psVar6 = B->b;
        iVar14 = 0;
        do {
          psVar4[iVar14] = psVar2[iVar14];
          if (-1 < iVar14) {
            psVar7 = pAVar9->A[iVar14];
            uVar16 = 0;
            do {
              psVar7[uVar16] = psVar2[uVar16];
              uVar16 = uVar16 + 1;
            } while (iVar14 + 1 != uVar16);
          }
          lVar15 = 1;
          lVar13 = 0;
          do {
            sVar17 = psVar3[lVar13];
            lVar11 = 0;
            do {
              sVar17 = sVar17 + psVar2[lVar11];
              psVar3[lVar13] = sVar17;
              lVar11 = lVar11 + 1;
            } while (lVar15 != lVar11);
            lVar13 = lVar13 + 1;
            lVar15 = lVar15 + 1;
          } while (lVar13 != lVar10);
          lVar13 = 0;
          do {
            psVar6[lVar13] = psVar5[lVar13];
            if (lVar13 != 0) {
              psVar7 = B->A[lVar13];
              lVar15 = 0;
              do {
                psVar7[lVar15] = psVar5[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar13 != lVar15);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar10);
          lVar13 = 0;
          do {
            if (lVar13 == 0) {
              iVar14 = 1;
            }
            else {
              psVar7 = sprk_table->a;
              psVar8 = B->c;
              sVar17 = psVar8[lVar13];
              lVar15 = 0;
              do {
                sVar17 = sVar17 + psVar7[lVar15];
                psVar8[lVar13] = sVar17;
                lVar15 = lVar15 + 1;
              } while (lVar13 != lVar15);
              iVar14 = (int)lVar15 + 1;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar10);
          B->q = iVar1;
          pAVar9->q = iVar1;
          B->p = 0;
          pAVar9->p = 0;
        } while (iVar14 < iVar12);
      }
      *a_ptr = B;
      *b_ptr = pAVar9;
      iVar12 = 0;
    }
  }
  return iVar12;
}

Assistant:

int ARKodeSPRKTable_ToButcher(ARKodeSPRKTable sprk_table,
                              ARKodeButcherTable* a_ptr,
                              ARKodeButcherTable* b_ptr)
{
  int i                = 0;
  int j                = 0;
  ARKodeButcherTable a = NULL;
  ARKodeButcherTable b = NULL;

  a = ARKodeButcherTable_Alloc(sprk_table->stages, SUNFALSE);
  if (!a) { return ARK_MEM_FAIL; }
  b = ARKodeButcherTable_Alloc(sprk_table->stages, SUNFALSE);
  if (!b)
  {
    if (a) { ARKodeButcherTable_Free(a); }
    return ARK_MEM_FAIL;
  }

  /* DIRK table */
  for (i = 0; i < sprk_table->stages; ++i)
  {
    b->b[i] = sprk_table->ahat[i];
    for (j = 0; j <= i; ++j) { b->A[i][j] = sprk_table->ahat[j]; }
    /* Time weights: C_j = sum_{i=0}^{j} b_i */

    /* Time weights: C_j = sum_{i=0}^{j-1} b_i */
    for (j = 0; j < sprk_table->stages; ++j)
    {
      for (i = 0; i <= j; ++i) { b->c[j] += sprk_table->ahat[i]; }
    }

    /* Explicit table */
    for (i = 0; i < sprk_table->stages; ++i)
    {
      a->b[i] = sprk_table->a[i];
      for (j = 0; j < i; ++j) { a->A[i][j] = sprk_table->a[j]; }
    }

    /* Time weights: c_j = sum_{i=0}^{j-1} a_i */
    for (j = 0; j < sprk_table->stages; ++j)
    {
      for (i = 0; i < j; ++i) { a->c[j] += sprk_table->a[i]; }
    }

    /* Set method order */
    a->q = sprk_table->q;
    b->q = sprk_table->q;

    /* No embedding, so set embedding order to 0 */
    a->p = 0;
    b->p = 0;
  }

  *a_ptr = a;
  *b_ptr = b;

  return ARK_SUCCESS;
}